

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_Basics_Test::TestBody(TypeTest_Basics_Test *this)

{
  AssertHelperData *pAVar1;
  pointer pHVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  Nullability NVar5;
  int iVar6;
  ulong uVar7;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> uVar8;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> uVar9;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  Struct *lhs;
  Type __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar10;
  pointer pcVar11;
  char *in_R9;
  pointer *__ptr;
  initializer_list<wasm::Type> __l;
  initializer_list<wasm::Field> __l_00;
  Array AVar12;
  initializer_list<wasm::Field> __l_01;
  Type local_f0;
  AssertHelper local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_e0;
  pointer local_d8;
  undefined1 local_c8 [24];
  byte local_b0;
  undefined1 local_a0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  allocator_type local_71;
  TypeBuilder local_70;
  TypeBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  Type TStack_40;
  pointer local_38;
  undefined1 local_30 [8];
  Type local_28;
  
  ::wasm::TypeBuilder::TypeBuilder(&local_70,3);
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       ::wasm::TypeBuilder::size();
  local_e8.data_ = (AssertHelperData *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"builder.size()","size_t{3}",(unsigned_long *)&builder,
             (unsigned_long *)&local_e8);
  if ((internal)local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&builder);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0xa9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&builder);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl +
                  8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_c8._8_8_);
    }
    goto LAB_001d9cd6;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_
                );
  }
  NVar5 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_70);
  uVar7 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_70,NVar5,Inexact);
  NVar5 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_70);
  uVar8._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )::wasm::TypeBuilder::getTempRefType((HeapType)&local_70,NVar5,Inexact);
  NVar5 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_70);
  uVar9._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )::wasm::TypeBuilder::getTempRefType((HeapType)&local_70,NVar5,Exact);
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  __l._M_len = 2;
  __l._M_array = (iterator)&builder;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       uVar8._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_c8,__l,
             (allocator_type *)&local_e8);
  ::wasm::TypeBuilder::getTempTupleType((vector *)&local_70);
  if ((AssertHelperData *)local_c8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
  }
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&builder;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       uVar9._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_c8,__l_00,
             (allocator_type *)local_a0);
  local_e8.data_ = (AssertHelperData *)local_c8._0_8_;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_;
  local_d8 = (pointer)local_c8._16_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_70,(Signature)(auVar3 << 0x40));
  ::wasm::TypeBuilder::setHeapType((ulong)&local_70,(Struct *)0x1);
  local_c8._0_8_ = (AssertHelperData *)0x22;
  local_c8._8_8_ = &DAT_100000000;
  AVar12.element._8_8_ = local_c8;
  AVar12.element.type.id = 2;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_70,AVar12);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_70,0);
  ::wasm::TypeBuilder::build();
  local_a0[0] = (allocator_type)(local_b0 == 0);
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if ((bool)local_a0[0]) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)local_c8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_a0,__x);
    local_48 = (undefined1  [8])
               ((long)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_start -
                CONCAT71(local_a0._1_7_,local_a0[0]) >> 3);
    local_30 = (undefined1  [8])0x3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&builder,"built.size()","size_t{3}",(unsigned_long *)local_48,
               (unsigned_long *)local_30);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_48);
      if (pbStack_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xbd,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)local_48);
LAB_001d9b61:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
      if (local_48 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_48 + 8))();
      }
LAB_001d9b79:
      if (pbStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pbStack_60;
        __ptr_00.id = (uintptr_t)pbStack_60;
        goto LAB_001d9c82;
      }
    }
    else {
      if (pbStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_60,pbStack_60);
      }
      iVar6 = ::wasm::HeapType::getKind();
      local_48[0] = iVar6 == 1;
      TStack_40.id = 0;
      if (iVar6 == 1) {
        iVar6 = ::wasm::HeapType::getKind();
        local_48[0] = iVar6 == 2;
        TStack_40.id = 0;
        if (iVar6 == 2) {
          iVar6 = ::wasm::HeapType::getKind();
          local_48[0] = iVar6 == 3;
          TStack_40.id = 0;
          if (iVar6 == 3) {
            pAVar1 = *(AssertHelperData **)(CONCAT71(local_a0._1_7_,local_a0[0]) + 8);
            if ((((uint)((AssertHelperData *)0x7c < pAVar1) * 4 + 3 & (uint)pAVar1) != 0) ||
               (pHVar2 = *(pointer *)(CONCAT71(local_a0._1_7_,local_a0[0]) + 0x10),
               ((uint)((pointer)0x7c < pHVar2) * 4 + 3 & (uint)pHVar2) != 0)) {
              __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                            ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
            }
            _local_48 = (Signature)::wasm::HeapType::getSignature();
            built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pHVar2;
            ::wasm::Type::Type(&local_f0,
                               &built.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,2);
            local_28.id = local_f0.id;
            local_30 = (undefined1  [8])pAVar1;
            testing::internal::CmpHelperEQ<wasm::Signature,wasm::Signature>
                      ((internal *)&builder,"built[0].getSignature()",
                       "Signature(newRefStruct, {newRefArray, Type::i32})",(Signature *)local_48,
                       (Signature *)local_30);
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)local_48);
              if (pbStack_60 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (pbStack_60->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xca,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_30,(Message *)local_48);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )local_48 !=
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                (**(code **)(*(long *)local_48 + 8))();
              }
            }
            if (pbStack_60 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_60,pbStack_60);
            }
            lhs = (Struct *)::wasm::HeapType::getStruct();
            built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)((ulong)pHVar2 | 2);
            __l_01._M_len = 1;
            __l_01._M_array =
                 (iterator)
                 &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_01,
                       &local_71);
            builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
                 (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 )(unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   )local_48;
            pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         TStack_40.id;
            local_58._M_allocated_capacity = (size_type)local_38;
            local_48 = (undefined1  [8])0x0;
            TStack_40.id = 0;
            local_38 = (pointer)0x0;
            testing::internal::CmpHelperEQ<wasm::Struct,wasm::Struct>
                      ((internal *)local_30,"built[1].getStruct()",
                       "Struct({Field(newRefNullArray, Immutable)})",lhs,(Struct *)&builder);
            if (builder.impl._M_t.
                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
                (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                 )0x0) {
              operator_delete((void *)builder.impl._M_t.
                                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                      _M_head_impl,
                              local_58._M_allocated_capacity -
                              (long)builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl);
            }
            if (local_48 != (undefined1  [8])0x0) {
              operator_delete((void *)local_48,(long)local_38 - (long)local_48);
            }
            if (local_30[0] == (internal)0x0) {
              testing::Message::Message((Message *)&builder);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28.id
                  == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar10 = "";
              }
              else {
                pcVar10 = *(char **)local_28.id;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xcb,pcVar10);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_48,(Message *)&builder);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
              if (builder.impl._M_t.
                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)builder.impl._M_t.
                                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                      _M_head_impl + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28.id !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_28,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_28.id);
            }
            ::wasm::HeapType::getArray();
            local_30 = (undefined1  [8])0x22;
            local_28.id = 0x100000000;
            testing::internal::CmpHelperEQ<wasm::Array,wasm::Array>
                      ((internal *)&builder,"built[2].getArray()",
                       "Array(Field(refNullAny, Mutable))",(Array *)local_48,(Array *)local_30);
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)local_48);
              if (pbStack_60 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (pbStack_60->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xcc,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_30,(Message *)local_48);
              goto LAB_001d9b61;
            }
            goto LAB_001d9b79;
          }
          testing::Message::Message((Message *)local_30);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&builder,(internal *)local_48,(AssertionResult *)"built[2].isArray()"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0xc2,(char *)builder.impl._M_t.
                                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                   _M_head_impl);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(Message *)local_30);
        }
        else {
          testing::Message::Message((Message *)local_30);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&builder,(internal *)local_48,
                     (AssertionResult *)"built[1].isStruct()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0xc1,(char *)builder.impl._M_t.
                                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                   _M_head_impl);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(Message *)local_30);
        }
      }
      else {
        testing::Message::Message((Message *)local_30);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&builder,(internal *)local_48,
                   (AssertionResult *)"built[0].isSignature()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0xc0,(char *)builder.impl._M_t.
                                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                 _M_head_impl);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(Message *)local_30);
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&TStack_40;
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
          &local_58) {
        operator_delete((void *)builder.impl._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl,local_58._M_allocated_capacity + 1);
      }
      if (local_30 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_30 + 8))();
      }
      __ptr_00.id = TStack_40.id;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)TStack_40.id !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_001d9c82:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __ptr_00.id);
      }
    }
    pvVar4 = (void *)CONCAT71(local_a0._1_7_,local_a0[0]);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)built.
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4);
    }
  }
  else {
    testing::Message::Message((Message *)local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)local_a0,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0xbb,(char *)builder.impl._M_t.
                             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_30,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_30);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
        &local_58) {
      operator_delete((void *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      local_58._M_allocated_capacity + 1);
    }
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
    if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&built,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                   .super__Vector_impl_data._M_start);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_b0]._M_data)
            ((anon_class_1_0_00000001 *)&builder,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)local_c8);
  if (local_e8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_e8.data_,(long)local_d8 - (long)local_e8.data_);
  }
LAB_001d9cd6:
  ::wasm::TypeBuilder::~TypeBuilder(&local_70);
  return;
}

Assistant:

TEST_F(TypeTest, Basics) {
  // (type $sig (func (param (ref $struct)) (result (ref $array) i32)))
  // (type $struct (struct (field (ref null $array))))
  // (type $array (array (mut anyref)))
  TypeBuilder builder(3);
  ASSERT_EQ(builder.size(), size_t{3});

  Type refStruct = builder.getTempRefType(builder[1], NonNullable);
  Type refArray = builder.getTempRefType(builder[2], NonNullable);
  Type refNullArray = builder.getTempRefType(builder[2], Nullable);
  Type refNullAny(HeapType::any, Nullable);

  Signature sig(refStruct, builder.getTempTupleType({refArray, Type::i32}));
  Struct struct_({Field(refNullArray, Immutable)});
  Array array(Field(refNullAny, Mutable));

  builder[0] = sig;
  builder[1] = struct_;
  builder[2] = array;

  builder.createRecGroup(0, 3);

  auto result = builder.build();
  ASSERT_TRUE(result);
  std::vector<HeapType> built = *result;
  ASSERT_EQ(built.size(), size_t{3});

  // The built types should have the correct kinds.
  ASSERT_TRUE(built[0].isSignature());
  ASSERT_TRUE(built[1].isStruct());
  ASSERT_TRUE(built[2].isArray());

  // The built types should have the correct structure.
  Type newRefStruct = Type(built[1], NonNullable);
  Type newRefArray = Type(built[2], NonNullable);
  Type newRefNullArray = Type(built[2], Nullable);

  EXPECT_EQ(built[0].getSignature(),
            Signature(newRefStruct, {newRefArray, Type::i32}));
  EXPECT_EQ(built[1].getStruct(), Struct({Field(newRefNullArray, Immutable)}));
  EXPECT_EQ(built[2].getArray(), Array(Field(refNullAny, Mutable)));
}